

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

ParameterValueAssignmentSyntax * __thiscall
slang::parsing::Parser::parseParameterValueAssignment(Parser *this)

{
  bool bVar1;
  int iVar2;
  SourceLocation location;
  ParamAssignmentSyntax *pPVar3;
  undefined4 extraout_var;
  ParameterValueAssignmentSyntax *pPVar5;
  Info *extraout_RDX;
  Info *pIVar6;
  size_t extraout_RDX_00;
  BumpAllocator *dst;
  TokenKind TVar7;
  TokenKind TVar8;
  Token hash;
  Token TVar9;
  Token TVar10;
  Token local_210;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_200;
  undefined1 local_1f0;
  Info *local_1e8;
  undefined8 local_1e0;
  Token openParen;
  SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> local_1c8 [7];
  pointer pTVar4;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,Hash);
  if (!bVar1) {
    return (ParameterValueAssignmentSyntax *)0x0;
  }
  TVar9 = ParserBase::consume(&this->super_ParserBase);
  local_1e8 = TVar9.info;
  local_1e0 = TVar9._0_8_;
  Token::Token(&openParen);
  Token::Token(&local_210);
  openParen = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  if ((openParen._0_4_ >> 0x10 & 1) != 0) {
    location = Token::location(&openParen);
    local_210 = ParserBase::missingToken(&this->super_ParserBase,CloseParenthesis,location);
    pTVar4 = (pointer)0x0;
    local_1c8[0].super_SyntaxListBase.childCount = 0;
    goto LAB_002c5401;
  }
  local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&local_1c8[0].super_SyntaxListBase.super_SyntaxNode.previewNode;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.kind = Unknown;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode._4_4_ = 0;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x10;
  TVar9 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9.kind);
  if (bVar1) {
    local_210 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
LAB_002c53da:
    pIVar6 = local_210.info;
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleParamAssignment(TVar9.kind);
    if (bVar1) {
      do {
        pIVar6 = TVar9.info;
        pPVar3 = parseParamValue(this);
        local_200._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pPVar3;
        local_1f0 = 1;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_200._M_first);
        TVar10 = ParserBase::peek(&this->super_ParserBase);
        TVar7 = TVar10.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar7);
        if (TVar7 == EndOfFile || bVar1) break;
        if (TVar7 != Comma) {
          ParserBase::expect(&this->super_ParserBase,Comma);
          do {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleParamAssignment,&slang::syntax::SyntaxFacts::isEndOfParenList>
                              (&this->super_ParserBase,(DiagCode)0x2d0005,false);
            if (!bVar1) {
              local_210 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
              goto LAB_002c53da;
            }
            bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
          } while (!bVar1);
        }
        local_200._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_1f0 = 0;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_200._M_first);
        TVar10 = ParserBase::peek(&this->super_ParserBase);
        TVar7 = TVar10.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar7);
        if (TVar7 == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        TVar8 = TVar9.kind;
        TVar9 = TVar10;
      } while ((pIVar6 != TVar10.info || TVar8 != TVar7) ||
              (bVar1 = ParserBase::
                       skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleParamAssignment,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                 (&this->super_ParserBase,(DiagCode)0x2d0005,true), bVar1));
      local_210 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      goto LAB_002c53da;
    }
    ParserBase::reportMissingList
              (&this->super_ParserBase,TVar9,CloseParenthesis,&local_210,(DiagCode)0x2d0005);
    pIVar6 = extraout_RDX;
  }
  dst = (this->super_ParserBase).alloc;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,(EVP_PKEY_CTX *)dst,
                     (EVP_PKEY_CTX *)pIVar6);
  pTVar4 = (pointer)CONCAT44(extraout_var,iVar2);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,(EVP_PKEY_CTX *)dst);
  local_1c8[0].super_SyntaxListBase.childCount = extraout_RDX_00;
LAB_002c5401:
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0057ec20;
  hash.info = local_1e8;
  hash.kind = (undefined2)local_1e0;
  hash._2_1_ = local_1e0._2_1_;
  hash.numFlags.raw = local_1e0._3_1_;
  hash.rawLen = local_1e0._4_4_;
  local_1c8[0].elements._M_ptr = pTVar4;
  local_1c8[0].elements._M_extent._M_extent_value = local_1c8[0].super_SyntaxListBase.childCount;
  pPVar5 = slang::syntax::SyntaxFactory::parameterValueAssignment
                     (&this->factory,hash,openParen,local_1c8,local_210);
  return pPVar5;
}

Assistant:

ParameterValueAssignmentSyntax* Parser::parseParameterValueAssignment() {
    if (!peek(TokenKind::Hash))
        return nullptr;

    auto hash = consume();

    Token openParen;
    Token closeParen;
    std::span<TokenOrSyntax> list;
    parseList<isPossibleParamAssignment, isEndOfParenList>(
        TokenKind::OpenParenthesis, TokenKind::CloseParenthesis, TokenKind::Comma, openParen, list,
        closeParen, RequireItems::False, diag::ExpectedArgument,
        [this] { return &parseParamValue(); });

    return &factory.parameterValueAssignment(hash, openParen, list, closeParen);
}